

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_hd.c
# Opt level: O0

int add_hd_table_incremental
              (nghttp2_hd_context *context,nghttp2_hd_nv *nv,nghttp2_hd_map *map,uint32_t hash)

{
  uint32_t uVar1;
  nghttp2_mem *mem_00;
  size_t sVar2;
  size_t sVar3;
  nghttp2_hd_entry *pnVar4;
  bool bVar5;
  nghttp2_hd_entry *ent;
  size_t idx;
  nghttp2_mem *mem;
  size_t room;
  nghttp2_hd_entry *new_ent;
  int rv;
  uint32_t hash_local;
  nghttp2_hd_map *map_local;
  nghttp2_hd_nv *nv_local;
  nghttp2_hd_context *context_local;
  
  mem_00 = context->mem;
  sVar2 = entry_room(nv->name->len,nv->value->len);
  while( true ) {
    bVar5 = false;
    if (context->hd_table_bufsize_max < context->hd_table_bufsize + sVar2) {
      bVar5 = (context->hd_table).len != 0;
    }
    if (!bVar5) break;
    pnVar4 = hd_ringbuf_get(&context->hd_table,(context->hd_table).len - 1);
    sVar3 = entry_room(((pnVar4->nv).name)->len,((pnVar4->nv).value)->len);
    context->hd_table_bufsize = context->hd_table_bufsize - sVar3;
    hd_ringbuf_pop_back(&context->hd_table);
    if (map != (nghttp2_hd_map *)0x0) {
      hd_map_remove(map,pnVar4);
    }
    nghttp2_hd_entry_free(pnVar4);
    nghttp2_mem_free(mem_00,pnVar4);
  }
  if (context->hd_table_bufsize_max < sVar2) {
    context_local._4_4_ = 0;
  }
  else {
    pnVar4 = (nghttp2_hd_entry *)nghttp2_mem_malloc(mem_00,0x50);
    if (pnVar4 == (nghttp2_hd_entry *)0x0) {
      context_local._4_4_ = -0x385;
    }
    else {
      nghttp2_hd_entry_init(pnVar4,nv);
      context_local._4_4_ = hd_ringbuf_push_front(&context->hd_table,pnVar4,mem_00);
      if (context_local._4_4_ == 0) {
        uVar1 = context->next_seq;
        context->next_seq = uVar1 + 1;
        pnVar4->seq = uVar1;
        pnVar4->hash = hash;
        if (map != (nghttp2_hd_map *)0x0) {
          hd_map_insert(map,pnVar4);
        }
        context->hd_table_bufsize = sVar2 + context->hd_table_bufsize;
        context_local._4_4_ = 0;
      }
      else {
        nghttp2_hd_entry_free(pnVar4);
        nghttp2_mem_free(mem_00,pnVar4);
      }
    }
  }
  return context_local._4_4_;
}

Assistant:

static int add_hd_table_incremental(nghttp2_hd_context *context,
                                    nghttp2_hd_nv *nv, nghttp2_hd_map *map,
                                    uint32_t hash) {
  int rv;
  nghttp2_hd_entry *new_ent;
  size_t room;
  nghttp2_mem *mem;

  mem = context->mem;
  room = entry_room(nv->name->len, nv->value->len);

  while (context->hd_table_bufsize + room > context->hd_table_bufsize_max &&
         context->hd_table.len > 0) {

    size_t idx = context->hd_table.len - 1;
    nghttp2_hd_entry *ent = hd_ringbuf_get(&context->hd_table, idx);

    context->hd_table_bufsize -=
        entry_room(ent->nv.name->len, ent->nv.value->len);

    DEBUGF("hpack: remove item from header table: %s: %s\n",
           (char *)ent->nv.name->base, (char *)ent->nv.value->base);

    hd_ringbuf_pop_back(&context->hd_table);
    if (map) {
      hd_map_remove(map, ent);
    }

    nghttp2_hd_entry_free(ent);
    nghttp2_mem_free(mem, ent);
  }

  if (room > context->hd_table_bufsize_max) {
    /* The entry taking more than NGHTTP2_HD_MAX_BUFFER_SIZE is
       immediately evicted.  So we don't allocate memory for it. */
    return 0;
  }

  new_ent = nghttp2_mem_malloc(mem, sizeof(nghttp2_hd_entry));
  if (new_ent == NULL) {
    return NGHTTP2_ERR_NOMEM;
  }

  nghttp2_hd_entry_init(new_ent, nv);

  rv = hd_ringbuf_push_front(&context->hd_table, new_ent, mem);

  if (rv != 0) {
    nghttp2_hd_entry_free(new_ent);
    nghttp2_mem_free(mem, new_ent);

    return rv;
  }

  new_ent->seq = context->next_seq++;
  new_ent->hash = hash;

  if (map) {
    hd_map_insert(map, new_ent);
  }

  context->hd_table_bufsize += room;

  return 0;
}